

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopsops.c
# Opt level: O2

LispPTR lcfuncall(uint atom_index,int argnum,int bytenum)

{
  DLword *pDVar1;
  short sVar2;
  LispPTR LVar3;
  int iVar4;
  LispPTR *pLVar5;
  int iVar6;
  
  if (atom_index == 0xffffffff) {
    error("Loops punt to nonexistent fn");
  }
  LVar3 = LAddrFromNative(MachineState.csp);
  MachineState.pvar[-5] = (short)LVar3 + (short)argnum * -2 + 4;
  MachineState.ivar = (DLword *)((ulong)((uint)MachineState.pvar[-5] * 2) + (long)Stackspace);
  MachineState.pvar[-6] =
       ((short)bytenum + (short)MachineState.currentpc) - (short)MachineState.currentfunc;
  pLVar5 = (LispPTR *)(MachineState.csp + 2);
  MachineState.csp = MachineState.csp + 2;
  *pLVar5 = MachineState.tosvalue;
  if ((atom_index & 0xfff0000) == 0) {
    pLVar5 = (LispPTR *)(AtomSpace + (ulong)(atom_index * 5) * 2);
  }
  else {
    pLVar5 = NativeAligned4FromLAddr(atom_index);
  }
  MachineState.currentfunc = (fnhead *)NativeAligned4FromLAddr(pLVar5[2] & 0xfffffff);
  if (-1 < (MachineState.currentfunc)->na) {
    iVar6 = argnum - (MachineState.currentfunc)->na;
    for (iVar4 = iVar6; iVar4 < 0; iVar4 = iVar4 + 1) {
      pDVar1 = MachineState.csp;
      MachineState.csp = MachineState.csp + 2;
      pDVar1[2] = 0;
      pDVar1[3] = 0;
    }
    iVar4 = 0;
    if (0 < iVar6) {
      iVar4 = iVar6;
    }
    MachineState.csp = MachineState.csp + -(long)(iVar4 * 2);
  }
  MachineState.csp = MachineState.csp + 2;
  *(undefined2 *)((ulong)MachineState.csp ^ 2) = 0x8000;
  *(DLword *)((ulong)(MachineState.csp + 1) ^ 2) = MachineState.pvar[-5];
  MachineState.csp = MachineState.csp + 2;
  *(undefined2 *)((ulong)MachineState.csp ^ 2) = 0xc000;
  LVar3 = LAddrFromNative(MachineState.pvar);
  *MachineState.csp = (DLword)LVar3;
  MachineState.pvar = MachineState.csp + 10;
  *(LispPTR *)(MachineState.csp + 2) = pLVar5[2] & 0xfffffff;
  MachineState.csp = MachineState.pvar;
  for (sVar2 = (MachineState.currentfunc)->pv + 1; 0 < sVar2; sVar2 = sVar2 + -1) {
    pDVar1 = MachineState.csp + 1;
    MachineState.csp[0] = 0;
    *pDVar1 = 0xffff;
    pDVar1 = MachineState.csp;
    MachineState.csp = MachineState.csp + 2;
    pDVar1[2] = 0;
    pDVar1[3] = 0xffff;
    MachineState.csp = MachineState.csp + 2;
  }
  MachineState.currentpc =
       (ByteCode *)
       ((long)&(MachineState.currentfunc)->na + (ulong)(MachineState.currentfunc)->startpc);
  return 0xfffffffe;
}

Assistant:

LispPTR lcfuncall(unsigned int atom_index, int argnum, int bytenum)
/* Atomindex for Function to invoke */
/* Number of ARGS on TOS and STK */
/* Number of bytes of Caller's
   OPCODE(including multi-byte) */
{
  struct definition_cell *defcell68k; /* Definition Cell PTR */
  short pv_num;                       /* scratch for pv */
  struct fnhead *tmp_fn;
  int rest; /* use for alignments */

  if (atom_index == 0xffffffff) error("Loops punt to nonexistent fn");

  /* Get Next Block offset from argnum */
  CURRENTFX->nextblock = (LAddrFromNative(CurrentStackPTR) & 0x0ffff) - (argnum << 1) + 4 /* +3  */;

  /* Setup IVar */
  IVar = NativeAligned2FromStackOffset(CURRENTFX->nextblock);

  /* Set PC to the Next Instruction and save into FX */
  CURRENTFX->pc = ((UNSIGNED)PC - (UNSIGNED)FuncObj) + bytenum;

  PushCStack; /* save TOS */

  /* Get DEFCELL 68k address */
  defcell68k = (struct definition_cell *)GetDEFCELL68k(atom_index);

  tmp_fn = (struct fnhead *)NativeAligned4FromLAddr(defcell68k->defpointer);

  if ((UNSIGNED)(CurrentStackPTR + tmp_fn->stkmin + STK_SAFE) >= (UNSIGNED)EndSTKP) {
    LispPTR test;
    test = *((LispPTR *)CurrentStackPTR);
    /* DOSTACKOVERFLOW(argnum,bytenum-1); XXX until we figure out what should be happening */
    S_CHECK(test == *((LispPTR *)CurrentStackPTR), "overflow in ccfuncall");
  }
  FuncObj = tmp_fn;

  if (FuncObj->na >= 0) {
    /* This Function is Spread Type */
    /* Arguments on Stack Adjustment  */
    rest = argnum - FuncObj->na;

    while (rest < 0) {
      PushStack(NIL_PTR);
      rest++;
    }
    CurrentStackPTR -= (rest << 1);
  } /* if end */

  /* Set up BF */
  CurrentStackPTR += 2;
  GETWORD(CurrentStackPTR) = BF_MARK;
  GETWORD(CurrentStackPTR + 1) = CURRENTFX->nextblock;
  CurrentStackPTR += 2;

  /* Set up FX */
  GETWORD(CurrentStackPTR) = FX_MARK;

  /* Now SET new FX */
  ((struct frameex1 *)CurrentStackPTR)->alink = LAddrFromNative(PVar);
  PVar = (DLword *)CurrentStackPTR + FRAMESIZE;
#ifdef BIGVM
  ((struct frameex1 *)CurrentStackPTR)->fnheader = (defcell68k->defpointer);
#else
  ((struct frameex1 *)CurrentStackPTR)->lofnheader = (defcell68k->defpointer) & 0x0ffff;
  ((struct frameex1 *)CurrentStackPTR)->hi2fnheader = ((defcell68k->defpointer) & SEGMASK) >> 16;
  ((struct frameex1 *)CurrentStackPTR)->hi1fnheader = 0;
#endif /* BIGVM */

  CurrentStackPTR = PVar;

  /* Set up PVar area */
  pv_num = FuncObj->pv + 1; /* Changed Apr.27 */

  while (pv_num > 0) {
    *((LispPTR *)CurrentStackPTR) = 0x0ffff0000;
    CurrentStackPTR += DLWORDSPER_CELL;
    *((LispPTR *)CurrentStackPTR) = 0x0ffff0000;
    CurrentStackPTR += DLWORDSPER_CELL;
    pv_num--;
  }

  /* Set PC points New Function's first OPCODE */
  PC = (ByteCode *)FuncObj + FuncObj->startpc;

  return -2; /* signal to OP_miscn to leave stack & pc alone */
}